

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrPrimitiveAssembler.hpp
# Opt level: O0

void rr::pa::LineStrip::
     exec<__gnu_cxx::__normal_iterator<rr::pa::Line*,std::vector<rr::pa::Line,std::allocator<rr::pa::Line>>>>
               (__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                outputIterator,VertexPacket **vertices,size_t numVertices,
               ProvokingVertex provokingConvention)

{
  reference pLVar1;
  __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
  local_58;
  Line local_50;
  ulong local_38;
  size_t ndx;
  VertexPacket *prev;
  size_t sStack_20;
  ProvokingVertex provokingConvention_local;
  size_t numVertices_local;
  VertexPacket **vertices_local;
  __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
  outputIterator_local;
  
  if (numVertices != 0) {
    ndx = (size_t)*vertices;
    local_38 = 1;
    prev._4_4_ = provokingConvention;
    sStack_20 = numVertices;
    numVertices_local = (size_t)vertices;
    vertices_local = &(outputIterator._M_current)->v0;
    for (; local_38 < sStack_20; local_38 = local_38 + 1) {
      Line::Line(&local_50,(VertexPacket *)ndx,*(VertexPacket **)(numVertices_local + local_38 * 8),
                 (uint)(prev._4_4_ != PROVOKINGVERTEX_FIRST));
      local_58 = __gnu_cxx::
                 __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                 ::operator++((__normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
                               *)&vertices_local,0);
      pLVar1 = __gnu_cxx::
               __normal_iterator<rr::pa::Line_*,_std::vector<rr::pa::Line,_std::allocator<rr::pa::Line>_>_>
               ::operator*(&local_58);
      pLVar1->v0 = local_50.v0;
      pLVar1->v1 = local_50.v1;
      pLVar1->provokingIndex = local_50.provokingIndex;
      ndx = *(size_t *)(numVertices_local + local_38 * 8);
    }
  }
  return;
}

Assistant:

static void exec (Iterator outputIterator, VertexPacket* const* vertices, size_t numVertices, rr::ProvokingVertex provokingConvention)
	{
		if (numVertices == 0)
		{
		}
		else
		{
			VertexPacket* prev = vertices[0];

			for (size_t ndx = 1; ndx < numVertices; ++ndx)
			{
				*(outputIterator++) = Line(prev, vertices[ndx], (provokingConvention == rr::PROVOKINGVERTEX_FIRST) ? (0) : (1));
				prev = vertices[ndx];
			}
		}
	}